

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O3

_Bool chck_buffer(chck_buffer *buf,size_t size,chck_endianess endianess)

{
  uint8_t *puVar1;
  
  if (buf == (chck_buffer *)0x0) {
    __assert_fail("buf",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/buffer.c"
                  ,0x6b,"_Bool chck_buffer(struct chck_buffer *, size_t, enum chck_endianess)");
  }
  if (size == 0) {
    puVar1 = (uint8_t *)0x0;
  }
  else {
    puVar1 = (uint8_t *)malloc(size);
    if (puVar1 == (uint8_t *)0x0) {
      return false;
    }
  }
  buf->step = 0x20;
  buf->endianess = false;
  buf->copied = true;
  *(undefined6 *)&buf->field_0x22 = 0;
  buf->endianess = (endianess & ~CHCK_ENDIANESS_NATIVE) != CHCK_ENDIANESS_LITTLE;
  buf->size = size;
  buf->curpos = puVar1;
  buf->buffer = puVar1;
  return true;
}

Assistant:

bool
chck_buffer(struct chck_buffer *buf, size_t size, enum chck_endianess endianess)
{
   assert(buf);

   void *data = NULL;
   if (size > 0 && !(data = malloc(size)))
      return false;

   if (unlikely(!chck_buffer_from_pointer(buf, data, size, endianess)))
      goto fail;

   buf->copied = true;
   return true;

fail:
   free(data);
   return false;
}